

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
miniros::Connection::writeHeader
          (Connection *this,M_string *key_vals,WriteFinishedFunc *finished_callback)

{
  int iVar1;
  uchar *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar2;
  uint32_t len;
  shared_ptr<unsigned_char[]> buffer;
  shared_ptr<unsigned_char[]> full_msg;
  uint local_6c;
  void *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  uint *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [16];
  code *local_30;
  code *local_28;
  
  std::function<void_(const_std::shared_ptr<miniros::Connection>_&)>::operator=
            (&this->header_written_callback_,finished_callback);
  iVar1 = (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Transport[0xb])();
  if ((char)iVar1 == '\0') {
    std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::Connection,void>
              ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)local_40,
               (__weak_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
    onHeaderWritten(this,(ConnectionPtr *)local_40);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8);
  }
  else {
    local_68 = (void *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Header::write((int)key_vals,&local_68,(size_t)&local_6c);
    uVar2 = local_6c + 4;
    __p = (uchar *)operator_new__((ulong)uVar2);
    std::__shared_ptr<unsigned_char[],(__gnu_cxx::_Lock_policy)2>::__shared_ptr<unsigned_char,void>
              ((__shared_ptr<unsigned_char[],(__gnu_cxx::_Lock_policy)2> *)&local_50,__p);
    memcpy(local_50 + 1,local_68,(ulong)local_6c);
    *local_50 = local_6c;
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:394:17)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:394:17)>
               ::_M_manager;
    local_40._0_8_ = this;
    write(this,(int)&local_50,(void *)(ulong)uVar2,(size_t)local_40);
    std::_Function_base::~_Function_base((_Function_base *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    this_00 = a_Stack_60;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return;
}

Assistant:

void Connection::writeHeader(const M_string& key_vals, const WriteFinishedFunc& finished_callback)
{
  MINIROS_ASSERT(!header_written_callback_);
  header_written_callback_ = finished_callback;

  if (!transport_->requiresHeader())
  {
    onHeaderWritten(shared_from_this());
    return;
  }

  std::shared_ptr<uint8_t[]> buffer;
  uint32_t len;
  Header::write(key_vals, buffer, len);

  uint32_t msg_len = len + 4;
  std::shared_ptr<uint8_t[]> full_msg(new uint8_t[msg_len]);
  memcpy(full_msg.get() + 4, buffer.get(), len);
  *((uint32_t*)full_msg.get()) = len;

  auto wrapFn = [this](const ConnectionPtr& conn)
  {
    this->onHeaderWritten(conn);
  };
  write(full_msg, msg_len, wrapFn, false);
}